

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalOperator::BuildPipelines
          (PhysicalOperator *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  pointer prVar3;
  pointer prVar4;
  int iVar5;
  PipelineBuildState *this_00;
  MetaPipeline *this_01;
  reference pvVar6;
  InternalException *this_02;
  allocator local_51;
  string local_50;
  
  _Var1._M_head_impl =
       (this->op_state).
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (this->op_state).
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  this_00 = MetaPipeline::GetState(meta_pipeline);
  iVar5 = (*this->_vptr_PhysicalOperator[0x21])(this);
  if ((char)iVar5 != '\0') {
    _Var2._M_head_impl =
         (this->sink_state).
         super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
    (this->sink_state).
    super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
    super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
    .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
    if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
    }
    PipelineBuildState::SetPipelineSource(this_00,current,this);
    this_01 = MetaPipeline::CreateChildMetaPipeline(meta_pipeline,current,this,REGULAR);
    pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       (&this->children,0);
    MetaPipeline::Build(this_01,pvVar6->_M_data);
    return;
  }
  prVar3 = (this->children).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar4 = (this->children).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar3 == prVar4) {
    PipelineBuildState::SetPipelineSource(this_00,current,this);
    return;
  }
  if ((long)prVar4 - (long)prVar3 == 8) {
    PipelineBuildState::AddPipelineOperator(this_00,current,this);
    pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       (&this->children,0);
    (*pvVar6->_M_data->_vptr_PhysicalOperator[0x26])(pvVar6->_M_data,current,meta_pipeline);
    return;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Operator not supported in BuildPipelines",&local_51);
  InternalException::InternalException(this_02,&local_50);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PhysicalOperator::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	op_state.reset();

	auto &state = meta_pipeline.GetState();
	if (IsSink()) {
		// operator is a sink, build a pipeline
		sink_state.reset();
		D_ASSERT(children.size() == 1);

		// single operator: the operator becomes the data source of the current pipeline
		state.SetPipelineSource(current, *this);

		// we create a new pipeline starting from the child
		auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
		child_meta_pipeline.Build(children[0]);
	} else {
		// operator is not a sink! recurse in children
		if (children.empty()) {
			// source
			state.SetPipelineSource(current, *this);
		} else {
			if (children.size() != 1) {
				throw InternalException("Operator not supported in BuildPipelines");
			}
			state.AddPipelineOperator(current, *this);
			children[0].get().BuildPipelines(current, meta_pipeline);
		}
	}
}